

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSiteObject.h
# Opt level: O3

BOOL __thiscall
Js::CrossSiteObject<Js::TypedArray<long,_false,_false>_>::SetAccessors
          (CrossSiteObject<Js::TypedArray<long,_false,_false>_> *this,PropertyId propertyId,
          Var getter,Var setter,PropertyOperationFlags flags)

{
  BOOL BVar1;
  Var getter_00;
  Var setter_00;
  
  if (getter == (Var)0x0) {
    getter_00 = (Var)0x0;
  }
  else {
    getter_00 = CrossSite::MarshalVar
                          ((((((this->super_TypedArray<long,_false,_false>).super_TypedArrayBase.
                               super_ArrayBufferParent.super_ArrayObject.super_DynamicObject.
                               super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                           super_JavascriptLibraryBase).scriptContext.ptr,getter,false);
  }
  if (setter == (Var)0x0) {
    setter_00 = (Var)0x0;
  }
  else {
    setter_00 = CrossSite::MarshalVar
                          ((((((this->super_TypedArray<long,_false,_false>).super_TypedArrayBase.
                               super_ArrayBufferParent.super_ArrayObject.super_DynamicObject.
                               super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                           super_JavascriptLibraryBase).scriptContext.ptr,setter,false);
  }
  BVar1 = TypedArrayBase::SetAccessors((TypedArrayBase *)this,propertyId,getter_00,setter_00,flags);
  return BVar1;
}

Assistant:

BOOL CrossSiteObject<T>::SetAccessors(PropertyId propertyId, Var getter, Var setter, PropertyOperationFlags flags)
    {
        if (getter != nullptr)
        {
            getter = CrossSite::MarshalVar(this->GetScriptContext(), getter);
        }
        if (setter != nullptr)
        {
            setter = CrossSite::MarshalVar(this->GetScriptContext(), setter);
        }
        return __super::SetAccessors(propertyId, getter, setter, flags);
    }